

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

void __thiscall MidiInAlsa::closePort(MidiInAlsa *this)

{
  undefined8 *puVar1;
  pthread_t __thread1;
  int iVar2;
  bool *__buf;
  
  puVar1 = (undefined8 *)(this->super_MidiInApi).super_MidiApi.apiData_;
  if ((this->super_MidiInApi).super_MidiApi.connected_ == true) {
    if (puVar1[2] != 0) {
      snd_seq_unsubscribe_port(*puVar1);
      snd_seq_port_subscribe_free(puVar1[2]);
      puVar1[2] = 0;
    }
    snd_seq_control_queue(*puVar1,*(undefined4 *)(puVar1 + 9),0x20,0,0);
    snd_seq_drain_output(*puVar1);
    (this->super_MidiInApi).super_MidiApi.connected_ = false;
  }
  if ((this->super_MidiInApi).inputData_.doInput == true) {
    __buf = &(this->super_MidiInApi).inputData_.doInput;
    *__buf = false;
    write(*(int *)(puVar1 + 10),__buf,1);
    __thread1 = puVar1[6];
    iVar2 = pthread_equal(__thread1,puVar1[7]);
    if (iVar2 == 0) {
      pthread_join(__thread1,(void **)0x0);
      return;
    }
  }
  return;
}

Assistant:

void MidiInAlsa :: closePort( void )
{
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);

  if ( connected_ ) {
    if ( data->subscription ) {
      snd_seq_unsubscribe_port( data->seq, data->subscription );
      snd_seq_port_subscribe_free( data->subscription );
      data->subscription = 0;
    }
    // Stop the input queue
#ifndef AVOID_TIMESTAMPING
    snd_seq_stop_queue( data->seq, data->queue_id, NULL );
    snd_seq_drain_output( data->seq );
#endif
    connected_ = false;
  }

  // Stop thread to avoid triggering the callback, while the port is intended to be closed
  if ( inputData_.doInput ) {
    inputData_.doInput = false;
    int res = write( data->trigger_fds[1], &inputData_.doInput, sizeof( inputData_.doInput ) );
    (void) res;
    if ( !pthread_equal( data->thread, data->dummy_thread_id ) )
      pthread_join( data->thread, NULL );
  }
}